

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          ExpressionSyntax *args_5,Token *args_6)

{
  AssertionItemPortListSyntax *pAVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  LetDeclarationSyntax *this_00;
  
  this_00 = (LetDeclarationSyntax *)allocate(this,0xa0,8);
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar10 = args_2->kind;
  uVar11 = args_2->field_0x2;
  NVar12.raw = (args_2->numFlags).raw;
  uVar13 = args_2->rawLen;
  pIVar3 = args_2->info;
  pAVar1 = *args_3;
  TVar14 = args_4->kind;
  uVar15 = args_4->field_0x2;
  NVar16.raw = (args_4->numFlags).raw;
  uVar17 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar18 = args_6->kind;
  uVar19 = args_6->field_0x2;
  NVar20.raw = (args_6->numFlags).raw;
  uVar21 = args_6->rawLen;
  pIVar5 = args_6->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,LetDeclaration,args);
  (this_00->let).kind = TVar6;
  (this_00->let).field_0x2 = uVar7;
  (this_00->let).numFlags = (NumericTokenFlags)NVar8.raw;
  (this_00->let).rawLen = uVar9;
  (this_00->let).info = pIVar2;
  (this_00->identifier).kind = TVar10;
  (this_00->identifier).field_0x2 = uVar11;
  (this_00->identifier).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->identifier).rawLen = uVar13;
  (this_00->identifier).info = pIVar3;
  this_00->portList = pAVar1;
  (this_00->equals).kind = TVar14;
  (this_00->equals).field_0x2 = uVar15;
  (this_00->equals).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->equals).rawLen = uVar17;
  (this_00->equals).info = pIVar4;
  (this_00->expr).ptr = args_5;
  (this_00->semi).kind = TVar18;
  (this_00->semi).field_0x2 = uVar19;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->semi).rawLen = uVar21;
  (this_00->semi).info = pIVar5;
  if (pAVar1 != (AssertionItemPortListSyntax *)0x0) {
    (pAVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }